

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsignal.cpp
# Opt level: O3

void __thiscall lsignal::slot::disconnect(slot *this)

{
  connection_cleaner *cleaner;
  vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_> cleaners;
  vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_> local_28;
  
  std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>::vector
            (&local_28,&this->_cleaners);
  for (; local_28.
         super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_28.
         super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_28.
      super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_28.
           super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    (((local_28.
       super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
       ._M_impl.super__Vector_impl_data._M_start)->data).
     super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->deleted =
         true;
  }
  std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>::clear
            (&this->_cleaners);
  std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>::~vector
            (&local_28);
  return;
}

Assistant:

void slot::disconnect()
	{
		decltype(_cleaners) cleaners = _cleaners;

		for (auto iter = cleaners.cbegin(); iter != cleaners.cend(); ++iter)
		{
			const connection_cleaner& cleaner = *iter;
			cleaner.data->deleted = true;
		}

		_cleaners.clear();
	}